

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_object.cpp
# Opt level: O0

string __thiscall mjs::error_object::to_string(error_object *this)

{
  gc_heap *h_00;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  wostream *__os;
  undefined8 extraout_RDX;
  error_object *in_RSI;
  string sVar2;
  wstring local_278 [32];
  wstring_view local_258;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_248;
  value local_238;
  string local_210;
  wstring_view local_200;
  value local_1e0;
  string local_1b8;
  wstring_view local_1a8;
  wostringstream local_198 [8];
  wostringstream woss;
  gc_heap *h;
  error_object *this_local;
  
  h_00 = object::heap((object *)in_RSI);
  std::__cxx11::wostringstream::wostringstream(local_198);
  get_name(&local_1e0,in_RSI);
  mjs::to_string((mjs *)&local_1b8,h_00,&local_1e0);
  local_1a8 = string::view(&local_1b8);
  pbVar1 = std::operator<<((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)local_198,local_1a8
                          );
  __os = std::operator<<(pbVar1,": ");
  std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
            (&local_248,L"message");
  (**(in_RSI->super_native_object).super_object._vptr_object)(&local_238,in_RSI,&local_248);
  mjs::to_string((mjs *)&local_210,h_00,&local_238);
  local_200 = string::view(&local_210);
  std::operator<<(__os,local_200);
  string::~string(&local_210);
  value::~value(&local_238);
  string::~string(&local_1b8);
  value::~value(&local_1e0);
  std::__cxx11::wostringstream::str();
  local_258 = (wstring_view)std::__cxx11::wstring::operator_cast_to_basic_string_view(local_278);
  string::string((string *)this,h_00,&local_258);
  std::__cxx11::wstring::~wstring(local_278);
  std::__cxx11::wostringstream::~wostringstream(local_198);
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (string)sVar2.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped;
}

Assistant:

string to_string() const {
        auto& h = heap();
        std::wostringstream woss;
        woss << mjs::to_string(h, get_name()).view() << ": " << mjs::to_string(h, get(L"message")).view();
        return string{h, woss.str()};
    }